

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O3

void os_sleep(int64_t usecs)

{
  timespec local_10;
  
  local_10.tv_sec = usecs / 1000000;
  local_10.tv_nsec = (usecs % 1000000) * 1000;
  clock_nanosleep(1,0,&local_10,(timespec *)0x0);
  return;
}

Assistant:

void os_sleep(int64_t usecs) {
#if defined __APPLE__
    usleep(usecs);
#elif defined __unix__
    struct timespec ts = {};
    ts.tv_sec = usecs / NUM_USECS_IN_A_SEC;
    ts.tv_nsec = (usecs - ts.tv_sec * NUM_USECS_IN_A_SEC) * 1000;
    clock_nanosleep(CLOCK_MONOTONIC, 0, &ts, NULL);
#elif defined _WIN64
    //
    // TODO: Windows version has milliseconds resolution
    //
    DWORD milliseconds = (DWORD)(usecs / 1000);
    Sleep(milliseconds);
#else
#error "Unsupported platform"
#endif
}